

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SccLiveness.cpp
# Opt level: O3

void __thiscall
SCCLiveness::ProcessStackSymUse(SCCLiveness *this,StackSym *stackSym,Instr *instr,int usageSize)

{
  ushort uVar1;
  Lifetime *lifetime;
  code *pcVar2;
  bool bVar3;
  uint newUseValue;
  JITTimeFunctionBody *this_00;
  char16 *pcVar4;
  FunctionJITTimeInfo *this_01;
  char16 *pcVar5;
  undefined4 *puVar6;
  ushort uVar7;
  wchar local_88 [4];
  char16 debugStringBuffer [42];
  
  lifetime = *(Lifetime **)&(stackSym->scratch).globOpt;
  if (lifetime == (Lifetime *)0x0) {
    this_00 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
    pcVar4 = JITTimeFunctionBody::GetDisplayName(this_00);
    this_01 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
    pcVar5 = FunctionJITTimeInfo::GetDebugNumberSet(this_01,(wchar (*) [42])local_88);
    Output::Print(L"Function: %s (%s)       ",pcVar4,pcVar5);
    Output::Print(L"Reg: ");
    Sym::Dump(&stackSym->super_Sym,(ValueType)0x9);
    Output::Print(L"\n");
    Output::Flush();
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/SccLiveness.cpp"
                       ,0x23a,"((0))","Uninitialized reg?");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  else {
    if (lifetime->region != this->curRegion) {
      bVar3 = Func::DoOptimizeTry(this->func);
      if (!bVar3) {
        lifetime->field_0x9d = lifetime->field_0x9d | 1;
      }
    }
    ExtendLifetime(this,lifetime,instr);
  }
  newUseValue = LinearScan::GetUseSpillCost
                          ((uint)this->loopNest,(uint)(this->lastOpHelperLabel != (LabelInstr *)0x0)
                          );
  Lifetime::AddToUseCount(lifetime,newUseValue,this->curLoop,this->func);
  if (lifetime->start < this->lastCall) {
    lifetime->field_0x9c = lifetime->field_0x9c | 2;
  }
  uVar1 = (ushort)*(undefined4 *)&lifetime->field_0x9c;
  uVar7 = uVar1 | 4;
  if (this->lastNonOpHelperCall <= lifetime->start) {
    uVar7 = uVar1;
  }
  *(ushort *)&lifetime->field_0x9c = uVar7 & 0xfff7;
  BVUnitT<unsigned_long>::AssertRange(usageSize);
  (lifetime->intUsageBv).word = (lifetime->intUsageBv).word | 1L << ((byte)usageSize & 0x3f);
  return;
}

Assistant:

void
SCCLiveness::ProcessStackSymUse(StackSym * stackSym, IR::Instr * instr, int usageSize)
{
    Lifetime * lifetime = stackSym->scratch.linearScan.lifetime;

    if (lifetime == nullptr)
    {
#if DBG
        char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
        Output::Print(_u("Function: %s (%s)       "), this->func->GetJITFunctionBody()->GetDisplayName(), this->func->GetDebugNumberSet(debugStringBuffer));
        Output::Print(_u("Reg: "));
        stackSym->Dump();
        Output::Print(_u("\n"));
        Output::Flush();
#endif
        AnalysisAssertMsg(UNREACHED, "Uninitialized reg?");
    }
    else
    {
        if (lifetime->region != this->curRegion && !this->func->DoOptimizeTry())
        {
            lifetime->dontAllocate = true;
        }

        ExtendLifetime(lifetime, instr);
    }
    lifetime->AddToUseCount(LinearScan::GetUseSpillCost(this->loopNest, (this->lastOpHelperLabel != nullptr)), this->curLoop, this->func);
    if (lifetime->start < this->lastCall)
    {
        lifetime->isLiveAcrossCalls = true;
    }
    if (lifetime->start < this->lastNonOpHelperCall)
    {
        lifetime->isLiveAcrossUserCalls = true;
    }
    lifetime->isDeadStore = false;

    lifetime->intUsageBv.Set(usageSize);
}